

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O1

bool __thiscall KeyValueFile::includeFile(KeyValueFile *this,char *inc_file_name,int include_depth)

{
  char cVar1;
  PrintErrorFunc p_Var2;
  pointer pcVar3;
  value_type *pvVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long *plVar9;
  long *plVar10;
  PrintErrorFunc p_Var11;
  ulong uVar12;
  StringKeyValue *value;
  value_type *__x;
  string combinedFileName;
  KeyValueFile kvFile;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  undefined1 local_98 [16];
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_80;
  undefined1 local_70 [32];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (include_depth < 0x10) {
    uVar12 = (this->fileName)._M_string_length;
    uVar6 = (uint)uVar12;
    uVar12 = uVar12 & 0xffffffff;
    uVar7 = uVar6 + 1;
    while (uVar8 = (int)uVar6 >> 0x1f & uVar6, 0 < (int)uVar12) {
      cVar1 = (this->fileName)._M_dataplus._M_p[uVar12 - 1];
      uVar7 = uVar7 - 1;
      uVar8 = uVar7;
      if ((cVar1 == '\\') || (uVar12 = uVar12 - 1, cVar1 == '/')) break;
    }
    pcVar3 = (this->fileName)._M_dataplus._M_p;
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pcVar3,pcVar3 + (int)uVar8);
    std::__cxx11::string::append((char *)&local_b8);
    local_88 = 0;
    aStack_80._M_allocated_capacity._0_4_ = aStack_80._M_allocated_capacity._0_4_ & 0xffffff00;
    local_70._16_4_ = 0;
    local_70._0_8_ = (value_type *)0x0;
    local_70._8_4_ = 0;
    local_70._12_4_ = 0;
    local_70._20_8_ = (ulong)(include_depth + 1) << 0x20;
    local_98._0_8_ = this->printErrorFunc;
    local_98._8_8_ = &aStack_80;
    bVar5 = loadFromFile((KeyValueFile *)local_98,(char *)local_b8);
    if ((bVar5) &&
       (pvVar4 = (value_type *)CONCAT44(local_70._12_4_,local_70._8_4_),
       (value_type *)local_70._0_8_ != pvVar4)) {
      __x = (value_type *)local_70._0_8_;
      do {
        std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>::
        push_back(&this->kv,__x);
        __x = __x + 1;
      } while (__x != pvVar4);
    }
    std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>::
    ~vector((vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_> *)
            local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._8_8_ != &aStack_80) {
      operator_delete((void *)local_98._8_8_);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
  }
  else {
    p_Var2 = this->printErrorFunc;
    if (p_Var2 != (PrintErrorFunc)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"ERROR: Maximum include depth exceeded on file \'","");
      plVar9 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar9[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar9;
      }
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      p_Var11 = (PrintErrorFunc)(plVar9 + 2);
      if ((PrintErrorFunc)*plVar9 == p_Var11) {
        local_88 = *(size_type *)p_Var11;
        aStack_80._M_allocated_capacity._0_4_ = *(undefined4 *)(plVar9 + 3);
        aStack_80._M_allocated_capacity._4_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
        local_98._0_8_ = &local_88;
      }
      else {
        local_88 = *(size_type *)p_Var11;
        local_98._0_8_ = (PrintErrorFunc)*plVar9;
      }
      local_98._8_8_ = plVar9[1];
      *plVar9 = (long)p_Var11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      (*p_Var2)((char *)local_98._0_8_);
      if ((size_type *)local_98._0_8_ != &local_88) {
        operator_delete((void *)local_98._0_8_);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool includeFile(const char * inc_file_name, int include_depth)
  {
    if (include_depth >= 16)
    {
      if (printErrorFunc)
        printErrorFunc(
          (std::string("ERROR: Maximum include depth exceeded on file '") + inc_file_name + "'\n").c_str());
      return false;
    }

    int len = int(fileName.length()) - 1;
    while (len >= 0)
    {
      if (fileName[len] == '\\' || fileName[len] == '/')
        break;
      len--;
    }

    std::string combinedFileName(fileName.c_str(), len + 1);
    combinedFileName += inc_file_name;

    KeyValueFile kvFile;
    kvFile.includeDepth = include_depth + 1;
    kvFile.printErrorFunc = printErrorFunc;

    bool ok = kvFile.loadFromFile(combinedFileName.c_str());

    if (ok)
      for (auto && value : kvFile.kv)
        kv.push_back(value);

    return ok;
  }